

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::CopyAnyArrayElementsToVar<unsigned_int>
               (JavascriptArray *dstArray,uint dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end)

{
  bool bVar1;
  undefined8 local_58;
  undefined8 local_50;
  JavascriptNativeFloatArray *nativeFloatArray;
  JavascriptNativeIntArray *nativeIntArray;
  uint32 end_local;
  uint32 start_local;
  JavascriptArray *srcArray_local;
  uint dstIndex_local;
  JavascriptArray *dstArray_local;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(srcArray);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(dstArray);
  bVar1 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(srcArray);
  if (bVar1) {
    local_50 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(srcArray);
  }
  else {
    local_50 = (JavascriptNativeIntArray *)0x0;
  }
  if (local_50 == (JavascriptNativeIntArray *)0x0) {
    bVar1 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(srcArray);
    if (bVar1) {
      local_58 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(srcArray);
    }
    else {
      local_58 = (JavascriptNativeFloatArray *)0x0;
    }
    if (local_58 == (JavascriptNativeFloatArray *)0x0) {
      CopyArrayElements(dstArray,dstIndex,srcArray,start,end);
    }
    else {
      CopyNativeFloatArrayElementsToVar(dstArray,dstIndex,local_58,start,end);
    }
  }
  else {
    CopyNativeIntArrayElementsToVar(dstArray,dstIndex,local_50,start,end);
  }
  return;
}

Assistant:

void JavascriptArray::CopyAnyArrayElementsToVar(JavascriptArray* dstArray, T dstIndex, JavascriptArray* srcArray, uint32 start, uint32 end)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(srcArray);
#endif
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(dstArray);
#endif
        JavascriptNativeIntArray * nativeIntArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(srcArray);
        if (nativeIntArray)
        {
            CopyNativeIntArrayElementsToVar(dstArray, dstIndex, nativeIntArray, start, end);
        }
        else
        {
            JavascriptNativeFloatArray * nativeFloatArray = JavascriptOperators::TryFromVar<JavascriptNativeFloatArray>(srcArray);
            if (nativeFloatArray)
            {
                CopyNativeFloatArrayElementsToVar(dstArray, dstIndex, nativeFloatArray, start, end);
            }
            else
            {
                CopyArrayElements(dstArray, dstIndex, srcArray, start, end);
            }
        }
    }